

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int VmIsIncludedFile(jx9_vm *pVm,SyString *pFile)

{
  void *pvVar1;
  int local_30;
  uint local_2c;
  sxu32 n;
  SyString *aEntries;
  SyString *pFile_local;
  jx9_vm *pVm_local;
  
  pvVar1 = (pVm->aIncluded).pBase;
  local_2c = 0;
  while( true ) {
    if ((pVm->aIncluded).nUsed <= local_2c) {
      return 0;
    }
    if (pFile->nByte == *(uint *)((long)pvVar1 + (ulong)local_2c * 0x10 + 8)) {
      local_30 = SyMemcmp(pFile->zString,*(void **)((long)pvVar1 + (ulong)local_2c * 0x10),
                          *(sxu32 *)((long)pvVar1 + (ulong)local_2c * 0x10 + 8));
    }
    else {
      local_30 = pFile->nByte - *(int *)((long)pvVar1 + (ulong)local_2c * 0x10 + 8);
    }
    if (local_30 == 0) break;
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

static int VmIsIncludedFile(jx9_vm *pVm, SyString *pFile)
{
	SyString *aEntries;
	sxu32 n;
	aEntries = (SyString *)SySetBasePtr(&pVm->aIncluded);
	/* Perform a linear search */
	for( n = 0 ; n < SySetUsed(&pVm->aIncluded) ; ++n ){
		if( SyStringCmp(pFile, &aEntries[n], SyMemcmp) == 0 ){
			/* Already included */
			return TRUE;
		}
	}
	return FALSE;
}